

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

nng_err nng_pipe_close(nng_pipe p)

{
  nng_err nVar1;
  nni_pipe *in_RAX;
  nni_pipe *local_18;
  nni_pipe *pipe;
  
  local_18 = in_RAX;
  nVar1 = nni_pipe_find(&local_18,p.id);
  if (nVar1 == NNG_OK) {
    nni_pipe_close(local_18);
    nni_pipe_rele(local_18);
  }
  return nVar1;
}

Assistant:

nng_err
nng_pipe_close(nng_pipe p)
{
	nng_err   rv;
	nni_pipe *pipe;

	if ((rv = nni_pipe_find(&pipe, p.id)) != 0) {
		return (rv);
	}
	nni_pipe_close(pipe);
	nni_pipe_rele(pipe);
	return (NNG_OK);
}